

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_get_message(Curl_easy *data,bufref *out)

{
  ulong uVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  size_t local_28;
  size_t len;
  char *message;
  bufref *out_local;
  Curl_easy *data_local;
  
  pcVar2 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
  uVar1 = (data->conn->proto).ftpc.pp.nfinal;
  if (uVar1 < 3) {
    Curl_bufref_set(out,"",0,(_func_void_void_ptr *)0x0);
  }
  else {
    local_28 = uVar1 - 2;
    len = (size_t)(pcVar2 + 2);
    while( true ) {
      bVar4 = true;
      if (*(char *)len != ' ') {
        bVar4 = *(char *)len == '\t';
      }
      sVar3 = local_28;
      if (!bVar4) break;
      len = len + 1;
      local_28 = local_28 - 1;
    }
    do {
      local_28 = sVar3;
      sVar3 = local_28 - 1;
      if (local_28 == 0) break;
    } while ((((*(char *)(len + sVar3) == '\r') || (*(char *)(len + sVar3) == '\n')) ||
             (*(char *)(len + sVar3) == ' ')) || (*(char *)(len + sVar3) == '\t'));
    *(undefined1 *)(len + 1 + sVar3) = 0;
    Curl_bufref_set(out,(void *)len,local_28,(_func_void_void_ptr *)0x0);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode imap_get_message(struct Curl_easy *data, struct bufref *out)
{
  char *message = Curl_dyn_ptr(&data->conn->proto.imapc.pp.recvbuf);
  size_t len = data->conn->proto.imapc.pp.nfinal;

  if(len > 2) {
    /* Find the start of the message */
    len -= 2;
    for(message += 2; *message == ' ' || *message == '\t'; message++, len--)
      ;

    /* Find the end of the message */
    while(len--)
      if(message[len] != '\r' && message[len] != '\n' && message[len] != ' ' &&
         message[len] != '\t')
        break;

    /* Terminate the message */
    message[++len] = '\0';
    Curl_bufref_set(out, message, len, NULL);
  }
  else
    /* junk input => zero length output */
    Curl_bufref_set(out, "", 0, NULL);

  return CURLE_OK;
}